

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_validation.h
# Opt level: O2

void Image_Function::
     OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
               (uint32_t *width,uint32_t *height,ImageTemplate<unsigned_char> *image,
               ImageTemplate<unsigned_char> *args)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  ImageTemplate<unsigned_char> IStack_48;
  
  uVar1 = *width;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&IStack_48,args);
  if ((image->_rowSize == uVar1) && (IStack_48._rowSize == uVar1)) {
    uVar2 = *width;
    uVar3 = *height;
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&IStack_48);
    if (uVar2 < (uint)(0xffffffff / (ulong)uVar3)) {
      *width = *height * *width;
      *height = 1;
    }
  }
  else {
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&IStack_48);
  }
  return;
}

Assistant:

void OptimiseRoi( uint32_t & width, uint32_t & height, const TImage & image, Args... args )
    {
        if( IsFullImageRow(width, image, args...) && ( width < (std::numeric_limits<uint32_t>::max() / height) ) ) {
            width = width * height;
            height = 1u;
        }
    }